

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryWriter::
write<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
          (BinaryWriter *this,
          vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_> *t)

{
  BinaryWriter *pBVar1;
  vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_> *in_RSI;
  BinaryWriter *in_RDI;
  size_t i;
  size_t size;
  unsigned_long *in_stack_ffffffffffffffa8;
  shared_ptr<pbrt::Camera> local_38;
  BinaryWriter *t_00;
  BinaryWriter *this_00;
  
  pBVar1 = (BinaryWriter *)
           std::
           vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
           size(in_RSI);
  this_00 = pBVar1;
  write<unsigned_long>(in_RDI,in_stack_ffffffffffffffa8);
  for (t_00 = (BinaryWriter *)0x0; t_00 < pBVar1;
      t_00 = (BinaryWriter *)
             ((long)&(t_00->serializedEntity).c.
                     super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
                     ._M_impl.super__Deque_impl_data._M_map + 1)) {
    std::vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
    operator[](in_RSI,(size_type)t_00);
    std::shared_ptr<pbrt::Camera>::shared_ptr((shared_ptr<pbrt::Camera> *)in_RDI,&local_38);
    write<pbrt::Camera>(this_00,(shared_ptr<pbrt::Camera> *)t_00);
    std::shared_ptr<pbrt::Camera>::~shared_ptr((shared_ptr<pbrt::Camera> *)0x12611f);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      for (size_t i=0;i<size;i++)
        write(t[i]);
    }